

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O3

Data * Data::equal(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  Data *pDVar1;
  Data *pDVar2;
  pointer ppDVar3;
  long lVar4;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  Data **ppDVar5;
  iterator __begin1;
  pointer ppDVar6;
  bool bVar7;
  
  ppDVar6 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pDVar1 = *ppDVar6;
  pDVar2 = ppDVar6[1];
  if (pDVar1 == (Data *)0x0) {
LAB_00104d4c:
    bVar7 = pDVar1->field_0xc == pDVar2->field_0xc;
LAB_00104d55:
    ppDVar5 = &falseData;
    if (bVar7) {
      ppDVar5 = &trueData;
    }
  }
  else {
    lVar4 = __dynamic_cast(pDVar1,&typeinfo,&Integer::typeinfo,0);
    if (lVar4 == 0) goto LAB_00104d4c;
    ppDVar5 = &falseData;
    if (pDVar2 != (Data *)0x0) {
      lVar4 = __dynamic_cast(pDVar2,&typeinfo,&Integer::typeinfo,0);
      if (lVar4 == 0) goto LAB_00104d67;
      bVar7 = pDVar1[1]._vptr_Data == pDVar2[1]._vptr_Data;
      goto LAB_00104d55;
    }
  }
LAB_00104d67:
  pDVar1 = *ppDVar5;
  ppDVar3 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppDVar6 != ppDVar3) {
    do {
      pDVar2 = *ppDVar6;
      if ((pDVar2 != (Data *)0x0) && (pDVar2->cited == 0)) {
        (*pDVar2->_vptr_Data[1])();
      }
      ppDVar6 = ppDVar6 + 1;
    } while (ppDVar6 != ppDVar3);
    ppDVar6 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppDVar6 == (pointer)0x0) goto LAB_00104da1;
  }
  operator_delete(ppDVar6);
LAB_00104da1:
  operator_delete(dataPara);
  return pDVar1;
}

Assistant:

Data *Data::equal(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    Data *a = (*dataPara)[0];
    Data *b = (*dataPara)[1];
    if (dynamic_cast<Integer *>(a) != NULL) {
        if (dynamic_cast<Integer *>(b) != NULL) {
            if (((Integer *) a)->value == ((Integer *) b)->value) {
                result = Data::trueData;
            } else {
                result = Data::falseData;
            }
        } else {
            result = Data::falseData;
        }
    } else {
        if (((Bool *) a)->value == ((Bool *) b)->value) {
            result = Data::trueData;
        } else {
            result = Data::falseData;
        }
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}